

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

void * mi_arena_area(mi_arena_id_t arena_id,size_t *size)

{
  mi_arena_t *pmVar1;
  size_t sVar2;
  size_t *in_RSI;
  mi_arena_id_t in_EDI;
  mi_arena_t *arena;
  size_t arena_index;
  uint8_t *local_8;
  
  if (in_RSI != (size_t *)0x0) {
    *in_RSI = 0;
  }
  sVar2 = mi_arena_id_index(in_EDI);
  if (sVar2 < 0x84) {
    pmVar1 = mi_arenas[sVar2];
    if (pmVar1 == (mi_arena_t *)0x0) {
      local_8 = (uint8_t *)0x0;
    }
    else {
      if (in_RSI != (size_t *)0x0) {
        sVar2 = mi_arena_block_size(pmVar1->block_count);
        *in_RSI = sVar2;
      }
      local_8 = pmVar1->start;
    }
  }
  else {
    local_8 = (uint8_t *)0x0;
  }
  return local_8;
}

Assistant:

void* mi_arena_area(mi_arena_id_t arena_id, size_t* size) {
  if (size != NULL) *size = 0;
  size_t arena_index = mi_arena_id_index(arena_id);
  if (arena_index >= MI_MAX_ARENAS) return NULL;
  mi_arena_t* arena = mi_atomic_load_ptr_acquire(mi_arena_t, &mi_arenas[arena_index]);
  if (arena == NULL) return NULL;
  if (size != NULL) { *size = mi_arena_block_size(arena->block_count); }
  return arena->start;
}